

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

ps_latlink_t * ps_lattice_traverse_edges(ps_lattice_t *dag,ps_latnode_t *start,ps_latnode_t *end)

{
  ps_latnode_s *ppVar1;
  ps_latlink_t *ppVar2;
  latlink_list_s *local_30;
  latlink_list_t *x;
  ps_latnode_t *node;
  ps_latnode_t *end_local;
  ps_latnode_t *start_local;
  ps_lattice_t *dag_local;
  
  ps_lattice_delq(dag);
  for (x = (latlink_list_t *)dag->nodes; x != (latlink_list_t *)0x0; x = (latlink_list_t *)x[4].link
      ) {
    *(undefined4 *)&x[2].link = 0;
  }
  for (x = (latlink_list_t *)dag->nodes; x != (latlink_list_t *)0x0; x = (latlink_list_t *)x[4].link
      ) {
    for (local_30 = x[2].next; local_30 != (latlink_list_s *)0x0; local_30 = local_30->next) {
      ppVar1 = local_30->link->to;
      (ppVar1->info).fanin = (ppVar1->info).fanin + 1;
    }
  }
  end_local = start;
  if (start == (ps_latnode_t *)0x0) {
    end_local = dag->start;
  }
  for (local_30 = end_local->exits; local_30 != (latlink_list_t *)0x0; local_30 = local_30->next) {
    ps_lattice_pushq(dag,local_30->link);
  }
  ppVar2 = ps_lattice_traverse_next(dag,end);
  return ppVar2;
}

Assistant:

ps_latlink_t *
ps_lattice_traverse_edges(ps_lattice_t *dag, ps_latnode_t *start, ps_latnode_t *end)
{
    ps_latnode_t *node;
    latlink_list_t *x;

    /* Cancel any unfinished traversal. */
    ps_lattice_delq(dag);

    /* Initialize node fanin counts and path scores. */
    for (node = dag->nodes; node; node = node->next)
        node->info.fanin = 0;
    for (node = dag->nodes; node; node = node->next) {
        for (x = node->exits; x; x = x->next)
            (x->link->to->info.fanin)++;
    }

    /* Initialize agenda with all exits from start. */
    if (start == NULL) start = dag->start;
    for (x = start->exits; x; x = x->next)
        ps_lattice_pushq(dag, x->link);

    /* Pull the first edge off the queue. */
    return ps_lattice_traverse_next(dag, end);
}